

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-mltpctive-dynamical-system.cpp
# Opt level: O2

void __thiscall
stateObservation::IMUMltpctiveDynamicalSystem::stateSum
          (IMUMltpctiveDynamicalSystem *this,Vector *stateVector,Vector *tangentVector,Vector *sum)

{
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> local_188;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4> local_158;
  VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> local_128;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_f8;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_90 [24];
  QuaternionBase<Eigen::Quaternion<double,_0>_> local_78 [32];
  QuaternionBase<Eigen::Quaternion<double,_0>_> local_58 [40];
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0x13);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_128,stateVector,0,3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_158,
             tangentVector,0,3);
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_
  ;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       m_data;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       _8_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_0>.m_data;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_0>._8_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.m_xpr;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
            m_startRow.m_value;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>._32_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       m_outerStride;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_188,sum,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const>>
            (&local_188.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_f8);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_128,stateVector,7,3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_158,
             tangentVector,6,3);
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_
  ;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       m_data;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       _8_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_0>.m_data;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_0>._8_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.m_xpr;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
            m_startRow.m_value;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>._32_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       m_outerStride;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_188,sum,7,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const>>
            (&local_188.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_f8);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_128,stateVector,0xd,3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_158,
             tangentVector,0xc,3);
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_
  ;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       m_data;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       _8_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_0>.m_data;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_0>._8_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.m_xpr;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
            m_startRow.m_value;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>._32_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       m_outerStride;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_188,sum,0xd,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const>>
            (&local_188.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_f8);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_f8,tangentVector
             ,3,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            (local_90,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                       *)&local_f8);
  kine::rotationVectorToQuaternion((Quaternion *)local_58,(Vector3 *)local_90);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4> *)&local_128,stateVector,
             3,4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,4,1,false>>
            ((Matrix<double,_4,_1,_0,_4,_1> *)local_78,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false> *)&local_128);
  Eigen::internal::
  quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
            (local_58,local_78);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>::VectorBlock(&local_158,sum,3,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,4,1,false>,Eigen::Matrix<double,4,1,0,4,1>>
            (&local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,
             (Matrix<double,_4,_1,_0,_4,_1> *)&local_188);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_128,stateVector,10,3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_158,
             tangentVector,9,3);
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_
  ;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       m_data;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       _8_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_0>.m_data;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_0>._8_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.m_xpr;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
            m_startRow.m_value;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>._32_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       m_outerStride;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_188,sum,10,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const>>
            (&local_188.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_f8);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_128,stateVector,0x10,3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_158,
             tangentVector,0xf,3);
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_
  ;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       m_data;
  local_f8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_128.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       _8_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_0>.m_data;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>,_0>._8_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.m_xpr;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
            m_startRow.m_value;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>._32_8_;
  local_f8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_158.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false,_true>.
       m_outerStride;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_188,sum,0x10,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const>>
            (&local_188.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_f8);
  return;
}

Assistant:

void IMUMltpctiveDynamicalSystem::stateSum(const Vector & stateVector, const Vector & tangentVector, Vector & sum)
{
  sum.resize(indexes::size);
  sum.segment<3>(indexes::pos) = stateVector.segment<3>(indexes::pos) + tangentVector.segment<3>(indexesTangent::pos);
  sum.segment<3>(indexes::linVel) =
      stateVector.segment<3>(indexes::linVel) + tangentVector.segment<3>(indexesTangent::linVel);
  sum.segment<3>(indexes::linAcc) =
      stateVector.segment<3>(indexes::linAcc) + tangentVector.segment<3>(indexesTangent::linAcc);

  sum.segment<4>(indexes::ori) = (kine::rotationVectorToQuaternion(tangentVector.segment<3>(indexesTangent::ori))
                                  * Quaternion(stateVector.segment<4>(indexes::ori)))
                                     .coeffs();
  sum.segment<3>(indexes::angVel) =
      stateVector.segment<3>(indexes::angVel) + tangentVector.segment<3>(indexesTangent::angVel);
  sum.segment<3>(indexes::angAcc) =
      stateVector.segment<3>(indexes::angAcc) + tangentVector.segment<3>(indexesTangent::angAcc);
}